

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifc_struct_defs.c
# Opt level: O2

uint16_t ll_gw_scan_result_serialize
                   (llabs_gateway_scan_results_t scan_result,uint8_t num_gw,uint8_t *buff)

{
  uint8_t *local_38;
  
  local_38 = buff + 1;
  *buff = num_gw;
  write_uint64(scan_result.id,&local_38);
  *local_38 = scan_result.rssi._1_1_;
  local_38[1] = (uint8_t)scan_result.rssi;
  local_38[2] = scan_result.snr;
  local_38[3] = scan_result.channel;
  local_38[4] = scan_result.is_repeater;
  return ((short)local_38 - (short)buff) + 5;
}

Assistant:

uint16_t ll_gw_scan_result_serialize(llabs_gateway_scan_results_t scan_result, const uint8_t num_gw,
                                     uint8_t buff[GW_SCAN_INFO_BUFF_SIZE])
{
    uint8_t *buff_cpy = buff;
    write_uint8(num_gw, &buff_cpy);
    write_uint64(scan_result.id, &buff_cpy);
    write_uint16(scan_result.rssi, &buff_cpy);
    write_uint8(scan_result.snr, &buff_cpy);
    write_uint8(scan_result.channel, &buff_cpy);
    write_uint8(scan_result.is_repeater, &buff_cpy);
    return buff_cpy - buff;
}